

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArduinoPressureSensor.cpp
# Opt level: O3

void * ArduinoPressureSensorThread(void *pParam)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  double dVar10;
  SOCKET SVar11;
  double dVar12;
  char *pcVar13;
  ulong uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  CHRONO chrono_filter;
  CHRONO chrono_period;
  ARDUINOPRESSURESENSORDATA arduinopressuresensordata;
  ARDUINOPRESSURESENSOR arduinopressuresensor;
  char szTemp [256];
  char szSaveFilePath [256];
  interval local_8c8;
  int local_8b0;
  int local_8ac;
  timespec local_8a8;
  double local_898;
  double dStack_890;
  double local_888;
  double dStack_880;
  timespec local_878;
  int local_868;
  timespec local_860;
  double local_850;
  double dStack_848;
  double local_840;
  double dStack_838;
  timespec local_830;
  int local_820;
  undefined1 local_818 [16];
  double local_808;
  double local_800;
  ARDUINOPRESSURESENSORDATA local_7f8;
  interval local_7d0;
  interval local_7b8;
  ARDUINOPRESSURESENSOR local_7a0;
  char local_238 [256];
  char local_138 [264];
  
  memset(&local_7a0,0,0x568);
  iVar6 = clock_getres(4,&local_878);
  if ((iVar6 == 0) && (iVar6 = clock_gettime(4,&local_8a8), iVar6 == 0)) {
    local_868 = 0;
    local_898 = 0.0;
    dStack_890 = 0.0;
    local_888 = 0.0;
    dStack_880 = 0.0;
  }
  iVar6 = clock_getres(4,&local_830);
  if ((iVar6 == 0) && (iVar6 = clock_gettime(4,&local_860), iVar6 == 0)) {
    local_820 = 0;
    local_850 = 0.0;
    dStack_848 = 0.0;
    local_840 = 0.0;
    dStack_838 = 0.0;
  }
  iVar6 = 0x32;
  local_818 = ZEXT816(0);
  bVar3 = false;
  local_8ac = 0;
  do {
    iVar8 = iVar6 / 1000;
    iVar7 = iVar6 % 1000;
    bVar3 = !bVar3;
    local_8b0 = iVar6;
    while( true ) {
      if (local_820 == 0) {
        clock_gettime(4,(timespec *)&local_8c8);
        local_850 = local_8c8.inf;
        dStack_848 = local_8c8.sup;
        local_8c8.inf =
             (double)((((long)local_8c8.inf + (long)local_840) - local_860.tv_sec) +
                     ((long)local_8c8.sup + (long)dStack_838) / 1000000000);
        local_8c8.sup =
             (double)(((long)local_8c8.sup + (long)dStack_838) % 1000000000 - local_860.tv_nsec);
        if ((long)local_8c8.sup < 0) {
          local_8c8.inf =
               (double)((long)local_8c8.inf + ~((ulong)-(long)local_8c8.sup / 1000000000));
          local_8c8.sup =
               (double)((long)local_8c8.sup + 1000000000 +
                       ((ulong)-(long)local_8c8.sup / 1000000000) * 1000000000);
        }
        local_840 = local_8c8.inf;
        dStack_838 = local_8c8.sup;
      }
      iVar6 = clock_getres(4,&local_830);
      if ((iVar6 == 0) && (iVar6 = clock_gettime(4,&local_860), iVar6 == 0)) {
        local_820 = 0;
        local_840 = 0.0;
        dStack_838 = 0.0;
        local_850 = 0.0;
        dStack_848 = 0.0;
      }
      local_8c8.inf = (double)(long)iVar8;
      local_8c8.sup = (double)(long)(iVar7 * 1000000);
      nanosleep((timespec *)&local_8c8,(timespec *)0x0);
      iVar6 = local_8b0;
      if (bPauseArduinoPressureSensor == 0) break;
      if (!bVar3) {
        puts("ArduinoPressureSensor paused.");
        SVar11 = local_7a0.RS232Port.s;
        switch(local_7a0.RS232Port.DevType) {
        case 0:
          iVar6 = (int)local_7a0.RS232Port.hDev;
          goto LAB_001ba0a8;
        case 1:
        case 3:
          iVar6 = local_7a0.RS232Port.s;
          break;
        case 2:
          shutdown(local_7a0.RS232Port.s,2);
          close(SVar11);
        case 4:
          iVar6 = local_7a0.RS232Port.s_srv;
          break;
        default:
          goto switchD_001ba070_default;
        }
        shutdown(iVar6,2);
LAB_001ba0a8:
        iVar6 = close(iVar6);
        pcVar13 = "ArduinoPressureSensor disconnected.";
        if (iVar6 != 0) {
switchD_001ba070_default:
          pcVar13 = "ArduinoPressureSensor disconnection failed.";
        }
        puts(pcVar13);
      }
      if (bExit != 0) goto LAB_001ba8d3;
      local_8c8.inf = 0.0;
      local_8c8.sup = 4.94065645841247e-316;
      nanosleep((timespec *)&local_8c8,(timespec *)0x0);
      bVar3 = true;
    }
    if (bRestartArduinoPressureSensor == 0) {
      if (bVar3) goto LAB_001ba25c;
      iVar8 = GetLatestDataArduinoPressureSensor(&local_7a0,&local_7f8);
      if (iVar8 == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        pressure_mes = local_7f8.Pressure;
        dVar12 = local_888;
        dVar10 = dStack_880;
        if (local_868 == 0) {
          clock_gettime(4,(timespec *)&local_8c8);
          dVar12 = (double)((((long)local_8c8.inf + (long)local_888) - local_8a8.tv_sec) +
                           ((long)local_8c8.sup + (long)dStack_880) / 1000000000);
          dVar10 = (double)(((long)local_8c8.sup + (long)dStack_880) % 1000000000 -
                           local_8a8.tv_nsec);
          if ((long)dVar10 < 0) {
            dVar12 = (double)((long)dVar12 + ~((ulong)-(long)dVar10 / 1000000000));
            dVar10 = (double)((long)dVar10 + 1000000000 +
                             ((ulong)-(long)dVar10 / 1000000000) * 1000000000);
          }
        }
        if (2.0 < (double)(long)dVar10 / 1000000000.0 + (double)(long)dVar12) {
          dVar12 = local_888;
          dVar10 = dStack_880;
          if (local_868 == 0) {
            clock_gettime(4,(timespec *)&local_8c8);
            dVar12 = (double)((((long)local_8c8.inf + (long)local_888) - local_8a8.tv_sec) +
                             ((long)local_8c8.sup + (long)dStack_880) / 1000000000);
            dVar10 = (double)(((long)local_8c8.sup + (long)dStack_880) % 1000000000 -
                             local_8a8.tv_nsec);
            if ((long)dVar10 < 0) {
              dVar12 = (double)((long)dVar12 + ~((ulong)-(long)dVar10 / 1000000000));
              dVar10 = (double)((long)dVar10 + 1000000000 +
                               ((ulong)-(long)dVar10 / 1000000000) * 1000000000);
            }
          }
          if ((double)(long)dVar10 / 1000000000.0 + (double)(long)dVar12 <= 3.0) {
            local_818._8_8_ = 0;
            local_818._0_8_ = local_7f8.Pressure;
          }
        }
        dVar12 = local_888;
        dVar10 = dStack_880;
        if (local_868 == 0) {
          clock_gettime(4,(timespec *)&local_8c8);
          dVar12 = (double)((((long)local_8c8.inf + (long)local_888) - local_8a8.tv_sec) +
                           ((long)local_8c8.sup + (long)dStack_880) / 1000000000);
          dVar10 = (double)(((long)local_8c8.sup + (long)dStack_880) % 1000000000 -
                           local_8a8.tv_nsec);
          if ((long)dVar10 < 0) {
            dVar12 = (double)((long)dVar12 + ~((ulong)-(long)dVar10 / 1000000000));
            dVar10 = (double)((long)dVar10 + 1000000000 +
                             ((ulong)-(long)dVar10 / 1000000000) * 1000000000);
          }
        }
        dVar15 = local_7f8.Pressure;
        if (3.0 < (double)(long)dVar10 / 1000000000.0 + (double)(long)dVar12) {
          uVar14 = -(ulong)(ABS(local_7f8.Pressure - local_818._0_8_) < 0.05);
          auVar16._0_8_ = (ulong)local_7f8.Pressure & uVar14;
          auVar16._8_8_ = 0;
          auVar2._8_4_ = local_818._8_4_;
          auVar2._0_8_ = ~uVar14 & (ulong)local_818._0_8_;
          auVar2._12_4_ = local_818._12_4_;
          local_818 = auVar16 | auVar2;
          dVar15 = local_818._0_8_;
        }
        local_800 = ((dVar15 - local_7a0.PressureRef) * -100000.0) /
                    (local_7a0.WaterDensity * 9.80665);
        interval::interval(&local_7b8,&local_800);
        local_808 = -z_pressure_acc;
        interval::interval(&local_7d0,&local_808,&z_pressure_acc);
        operator+(&local_7b8,&local_7d0);
        interval::operator=((interval *)&z_pressure,&local_8c8);
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        goto LAB_001ba8bd;
      }
      puts("Connection to an ArduinoPressureSensor lost.");
      SVar11 = local_7a0.RS232Port.s;
      iVar8 = local_8ac;
      switch(local_7a0.RS232Port.DevType) {
      case 0:
        iVar6 = (int)local_7a0.RS232Port.hDev;
        goto LAB_001ba61a;
      case 1:
      case 3:
        iVar6 = local_7a0.RS232Port.s;
        break;
      case 2:
        shutdown(local_7a0.RS232Port.s,2);
        close(SVar11);
      case 4:
        iVar6 = local_7a0.RS232Port.s_srv;
        break;
      default:
        goto switchD_001ba1b1_default;
      }
      shutdown(iVar6,2);
LAB_001ba61a:
      iVar6 = close(iVar6);
      pcVar13 = "ArduinoPressureSensor disconnected.";
      if (iVar6 != 0) {
switchD_001ba1b1_default:
        pcVar13 = "ArduinoPressureSensor disconnection failed.";
      }
      puts(pcVar13);
LAB_001ba293:
      if (ExitOnErrorCount <= iVar8 + 1 && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_001ba8d3:
        bVar4 = true;
        break;
      }
      bVar3 = false;
      bVar4 = true;
      iVar6 = local_8b0;
      local_8ac = iVar8 + 1;
    }
    else {
      if (!bVar3) {
        puts("Restarting an ArduinoPressureSensor.");
        SVar11 = local_7a0.RS232Port.s;
        switch(local_7a0.RS232Port.DevType) {
        case 0:
          iVar6 = (int)local_7a0.RS232Port.hDev;
          goto LAB_001ba231;
        case 1:
        case 3:
          iVar6 = local_7a0.RS232Port.s;
          break;
        case 2:
          shutdown(local_7a0.RS232Port.s,2);
          close(SVar11);
        case 4:
          iVar6 = local_7a0.RS232Port.s_srv;
          break;
        default:
          goto switchD_001ba145_default;
        }
        shutdown(iVar6,2);
LAB_001ba231:
        iVar6 = close(iVar6);
        pcVar13 = "ArduinoPressureSensor disconnected.";
        if (iVar6 != 0) {
switchD_001ba145_default:
          pcVar13 = "ArduinoPressureSensor disconnection failed.";
        }
        puts(pcVar13);
      }
      bRestartArduinoPressureSensor = 0;
LAB_001ba25c:
      iVar8 = ConnectArduinoPressureSensor(&local_7a0,"ArduinoPressureSensor0.txt");
      iVar6 = local_7a0.threadperiod;
      if (iVar8 != 0) {
        local_8c8.inf = 4.94065645841247e-324;
        local_8c8.sup = 0.0;
        nanosleep((timespec *)&local_8c8,(timespec *)0x0);
        iVar8 = local_8ac;
        goto LAB_001ba293;
      }
      local_7f8.pressure = 0.0;
      local_7f8.temperature = 0.0;
      local_7f8.depth = 0.0;
      local_7f8.altitude = 0.0;
      local_7f8.Pressure = 0.0;
      if (local_868 == 0) {
        clock_gettime(4,(timespec *)&local_8c8);
        local_898 = local_8c8.inf;
        dStack_890 = local_8c8.sup;
        local_8c8.inf =
             (double)((((long)local_8c8.inf + (long)local_888) - local_8a8.tv_sec) +
                     ((long)local_8c8.sup + (long)dStack_880) / 1000000000);
        local_8c8.sup =
             (double)(((long)local_8c8.sup + (long)dStack_880) % 1000000000 - local_8a8.tv_nsec);
        if ((long)local_8c8.sup < 0) {
          local_8c8.inf =
               (double)((long)local_8c8.inf + ~((ulong)-(long)local_8c8.sup / 1000000000));
          local_8c8.sup =
               (double)((long)local_8c8.sup + 1000000000 +
                       ((ulong)-(long)local_8c8.sup / 1000000000) * 1000000000);
        }
        local_888 = local_8c8.inf;
        dStack_880 = local_8c8.sup;
      }
      iVar8 = clock_getres(4,&local_878);
      if ((iVar8 == 0) && (iVar8 = clock_gettime(4,&local_8a8), iVar8 == 0)) {
        local_868 = 0;
        local_888 = 0.0;
        dStack_880 = 0.0;
        local_898 = 0.0;
        dStack_890 = 0.0;
      }
      if ((FILE *)local_7a0.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_7a0.pfSaveFile);
        local_7a0.pfSaveFile = (FILE *)0x0;
      }
      bVar3 = true;
      if (local_7a0.bSaveRawData == 0) {
LAB_001ba8bd:
        bVar3 = true;
        bVar4 = false;
      }
      else {
        if (local_7a0.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_238,"arduinopressuresensor",0x16);
        }
        else {
          sprintf(local_238,"%.127s",local_7a0.szCfgFilePath);
        }
        sVar9 = strlen(local_238);
        iVar8 = (int)sVar9 + 1;
        uVar14 = sVar9 & 0xffffffff;
        do {
          if ((int)uVar14 < 1) goto LAB_001ba4a7;
          uVar1 = uVar14 - 1;
          iVar8 = iVar8 + -1;
          lVar5 = uVar14 - 1;
          uVar14 = uVar1;
        } while (local_238[lVar5] != '.');
        if ((uVar1 != 0) && (iVar8 <= (int)sVar9)) {
          memset(local_238 + (uVar1 & 0xffffffff),0,sVar9 - (uVar1 & 0xffffffff));
        }
LAB_001ba4a7:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar13 = strtimeex_fns();
        bVar4 = false;
        local_8b0 = iVar6;
        sprintf(local_138,"log/%.127s_%.64s.txt",local_238,pcVar13);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        iVar6 = local_8b0;
        local_7a0.pfSaveFile = (FILE *)fopen(local_138,"w");
        if ((FILE *)local_7a0.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create ArduinoPressureSensor data file.");
          bVar4 = false;
          break;
        }
      }
    }
  } while (bExit == 0);
  if (local_820 == 0) {
    clock_gettime(4,(timespec *)&local_8c8);
    local_850 = local_8c8.inf;
    dStack_848 = local_8c8.sup;
    local_8c8.inf =
         (double)((((long)local_8c8.inf + (long)local_840) - local_860.tv_sec) +
                 ((long)local_8c8.sup + (long)dStack_838) / 1000000000);
    local_8c8.sup =
         (double)(((long)local_8c8.sup + (long)dStack_838) % 1000000000 - local_860.tv_nsec);
    if ((long)local_8c8.sup < 0) {
      local_8c8.inf = (double)((long)local_8c8.inf + ~((ulong)-(long)local_8c8.sup / 1000000000));
      local_8c8.sup =
           (double)((long)local_8c8.sup + 1000000000 +
                   ((ulong)-(long)local_8c8.sup / 1000000000) * 1000000000);
    }
    local_840 = local_8c8.inf;
    dStack_838 = local_8c8.sup;
  }
  if (local_868 == 0) {
    clock_gettime(4,(timespec *)&local_8c8);
    local_898 = local_8c8.inf;
    dStack_890 = local_8c8.sup;
    local_8c8.inf =
         (double)((((long)local_8c8.inf + (long)local_888) - local_8a8.tv_sec) +
                 ((long)local_8c8.sup + (long)dStack_880) / 1000000000);
    local_8c8.sup =
         (double)(((long)local_8c8.sup + (long)dStack_880) % 1000000000 - local_8a8.tv_nsec);
    if ((long)local_8c8.sup < 0) {
      local_8c8.inf = (double)((long)local_8c8.inf + ~((ulong)-(long)local_8c8.sup / 1000000000));
      local_8c8.sup =
           (double)((long)local_8c8.sup + 1000000000 +
                   ((ulong)-(long)local_8c8.sup / 1000000000) * 1000000000);
    }
    local_888 = local_8c8.inf;
    dStack_880 = local_8c8.sup;
  }
  if ((FILE *)local_7a0.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_7a0.pfSaveFile);
    local_7a0.pfSaveFile = (FILE *)0x0;
  }
  if (bVar4) goto LAB_001baaf3;
  switch(local_7a0.RS232Port.DevType) {
  case 0:
    goto LAB_001baad3;
  case 1:
  case 3:
    SVar11 = local_7a0.RS232Port.s;
    break;
  case 2:
    shutdown(local_7a0.RS232Port.s,2);
    close(local_7a0.RS232Port.s);
  case 4:
    SVar11 = local_7a0.RS232Port.s_srv;
    break;
  default:
    goto switchD_001baa9b_default;
  }
  shutdown(SVar11,2);
  local_7a0.RS232Port.hDev._0_4_ = SVar11;
LAB_001baad3:
  iVar6 = close((int)local_7a0.RS232Port.hDev);
  if (iVar6 == 0) {
    pcVar13 = "ArduinoPressureSensor disconnected.";
  }
  else {
switchD_001baa9b_default:
    pcVar13 = "ArduinoPressureSensor disconnection failed.";
  }
  puts(pcVar13);
LAB_001baaf3:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE ArduinoPressureSensorThread(void* pParam)
{
	ARDUINOPRESSURESENSOR arduinopressuresensor;
	ARDUINOPRESSURESENSORDATA arduinopressuresensordata;
	double pressure_prev = 0, filteredpressure = 0;
	CHRONO chrono_filter;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&arduinopressuresensor, 0, sizeof(ARDUINOPRESSURESENSOR));

	StartChrono(&chrono_filter);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseArduinoPressureSensor) 
		{ 
			if (bConnected)
			{
				printf("ArduinoPressureSensor paused.\n");
				bConnected = FALSE;
				DisconnectArduinoPressureSensor(&arduinopressuresensor);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartArduinoPressureSensor) 
		{ 
			if (bConnected)
			{
				printf("Restarting an ArduinoPressureSensor.\n");
				bConnected = FALSE;
				DisconnectArduinoPressureSensor(&arduinopressuresensor);
			}
			bRestartArduinoPressureSensor = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectArduinoPressureSensor(&arduinopressuresensor, "ArduinoPressureSensor0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = arduinopressuresensor.threadperiod;

				memset(&arduinopressuresensordata, 0, sizeof(arduinopressuresensordata));
				StopChronoQuick(&chrono_filter);
				StartChrono(&chrono_filter);

				if (arduinopressuresensor.pfSaveFile != NULL)
				{
					fclose(arduinopressuresensor.pfSaveFile); 
					arduinopressuresensor.pfSaveFile = NULL;
				}
				if ((arduinopressuresensor.bSaveRawData)&&(arduinopressuresensor.pfSaveFile == NULL)) 
				{
					if (strlen(arduinopressuresensor.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", arduinopressuresensor.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "arduinopressuresensor");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					arduinopressuresensor.pfSaveFile = fopen(szSaveFilePath, "w");
					if (arduinopressuresensor.pfSaveFile == NULL) 
					{
						printf("Unable to create ArduinoPressureSensor data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataArduinoPressureSensor(&arduinopressuresensor, &arduinopressuresensordata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = arduinopressuresensordata.Pressure;
				if ((GetTimeElapsedChronoQuick(&chrono_filter) > 2)&&(GetTimeElapsedChronoQuick(&chrono_filter) <= 3))
				{
					pressure_prev = arduinopressuresensordata.Pressure; // Initialization of pressure_prev...
				}
				if (GetTimeElapsedChronoQuick(&chrono_filter) > 3)
				{
					if (fabs(arduinopressuresensordata.Pressure-pressure_prev) < 0.05)
					{
						filteredpressure = arduinopressuresensordata.Pressure;
						pressure_prev = filteredpressure;
					}
					else
					{
						// Ignore outlier...
						filteredpressure = pressure_prev;
					}
				}
				else
				{
					filteredpressure = arduinopressuresensordata.Pressure;
				}
				z_pressure = Pressure2Height(filteredpressure, arduinopressuresensor.PressureRef, arduinopressuresensor.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to an ArduinoPressureSensor lost.\n");
				bConnected = FALSE;
				DisconnectArduinoPressureSensor(&arduinopressuresensor);
			}
		}

		//printf("ArduinoPressureSensorThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_filter);

	if (arduinopressuresensor.pfSaveFile != NULL)
	{
		fclose(arduinopressuresensor.pfSaveFile); 
		arduinopressuresensor.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectArduinoPressureSensor(&arduinopressuresensor);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}